

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::ToProperty<std::array<float,2ul>>
               (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *input,
               Property *output,string *err)

{
  undefined2 uVar1;
  void *pvVar2;
  bool bVar3;
  ulong uVar4;
  storage_t<tinyusdz::Animatable<std::array<float,_2UL>_>_> *psVar5;
  long lVar6;
  Animatable<std::array<float,_2UL>_> v;
  TimeSamples ts;
  char local_938;
  char cStack_937;
  TypedTimeSamples<std::array<float,_2UL>_> local_930;
  string *local_910;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *local_908;
  Property *local_900;
  storage_union local_8f8;
  undefined1 uStack_8e8;
  undefined7 uStack_8e7;
  undefined1 uStack_8e0;
  storage_union local_8d0;
  undefined **local_8c0;
  undefined1 local_8b8 [40];
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  storage_union local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  undefined1 local_5f0 [24];
  undefined1 local_5d8;
  
  local_8b8._0_8_ = local_8b8 + 0x10;
  local_8b8._8_8_ = 0;
  local_8b8[0x10] = '\0';
  local_8b8[0x24] = false;
  local_890._M_p = (pointer)&local_880;
  local_888 = 0;
  local_880._M_local_buf[0] = '\0';
  local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_870.dynamic = (void *)0x0;
  local_858 = false;
  local_850._0_8_ = (pointer)0x0;
  local_850[8] = 0;
  local_850._9_7_ = 0;
  local_850[0x10] = 0;
  local_850._17_8_ = 0;
  AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  AStack_818.elementSize.has_value_ = false;
  AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
  AStack_818.hidden.has_value_ = false;
  AStack_818.hidden.contained = (storage_t<bool>)0x0;
  AStack_818.comment.has_value_ = false;
  AStack_818.weight.contained = (storage_t<double>)0x0;
  AStack_818.connectability.has_value_ = false;
  AStack_818.bindMaterialAs.contained._16_8_ = 0;
  AStack_818.bindMaterialAs.contained._24_8_ = 0;
  AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.bindMaterialAs.contained._8_8_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.comment.contained._8_8_ = 0;
  AStack_818.comment.contained._16_8_ = 0;
  AStack_818.comment.contained._24_8_ = 0;
  AStack_818.comment.contained._32_8_ = 0;
  AStack_818.comment.contained._40_8_ = 0;
  AStack_818.customData.has_value_ = false;
  AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.customData.contained._8_8_ = 0;
  AStack_818.customData.contained._16_8_ = 0;
  AStack_818.customData.contained._24_8_ = 0;
  AStack_818.customData.contained._32_8_ = 0;
  AStack_818.customData.contained._40_8_ = 0;
  AStack_818.weight.has_value_ = false;
  AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.connectability.contained._8_8_ = 0;
  AStack_818.connectability.contained._16_8_ = 0;
  AStack_818.connectability.contained._24_8_ = 0;
  AStack_818.outputName.has_value_ = false;
  AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.outputName.contained._8_8_ = 0;
  AStack_818.outputName.contained._16_8_ = 0;
  AStack_818.outputName.contained._24_8_ = 0;
  AStack_818.renderType.has_value_ = false;
  AStack_818.sdrMetadata.has_value_ = false;
  AStack_818.renderType.contained._16_8_ = 0;
  AStack_818.renderType.contained._24_8_ = 0;
  AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.renderType.contained._8_8_ = 0;
  AStack_818.displayName.has_value_ = false;
  AStack_818.sdrMetadata.contained._32_8_ = 0;
  AStack_818.sdrMetadata.contained._40_8_ = 0;
  AStack_818.sdrMetadata.contained._16_8_ = 0;
  AStack_818.sdrMetadata.contained._24_8_ = 0;
  AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.sdrMetadata.contained._8_8_ = 0;
  AStack_818.displayGroup.has_value_ = false;
  AStack_818.displayName.contained._16_8_ = 0;
  AStack_818.displayName.contained._24_8_ = 0;
  AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayName.contained._8_8_ = 0;
  AStack_818.bindMaterialAs.has_value_ = false;
  AStack_818.displayGroup.contained._16_8_ = 0;
  AStack_818.displayGroup.contained._24_8_ = 0;
  AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayGroup.contained._8_8_ = 0;
  local_830[0x10] = 0;
  stack0xfffffffffffff7e1 = 0;
  local_830._0_8_ = (pointer)0x0;
  local_830[8] = 0;
  local_830._9_7_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8b8._32_4_ = Varying;
  local_610._8_8_ = 6;
  local_600._M_allocated_capacity._0_7_ = 0x3274616f6c66;
  local_910 = err;
  local_900 = output;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_610.dynamic = &local_600;
  ::std::__cxx11::string::_M_assign((string *)&local_890);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.dynamic != &local_600) {
    operator_delete(local_610.dynamic,local_600._M_allocated_capacity + 1);
  }
  if (input->_blocked == true) {
    local_858 = true;
  }
  if ((input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&input->_paths);
  }
  psVar5 = (storage_t<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)&input->_fallback;
  if ((input->_attrib).has_value_ != false) {
    psVar5 = &(input->_attrib).contained;
  }
  uVar1 = *(undefined2 *)((long)psVar5 + 8);
  pvVar2 = *(void **)psVar5;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  ::vector(&local_930._samples,
           (vector<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
            *)((long)psVar5 + 0x10));
  local_930._dirty = *(bool *)((long)psVar5 + 0x28);
  local_600._M_allocated_capacity =
       (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_610.dynamic = (void *)0x0;
  local_600._M_local_buf[8] = '\0';
  local_5f0._0_8_ = (pointer)0x0;
  local_5f0[8] = 0;
  local_5f0._9_7_ = 0;
  local_5f0[0x10] = 0;
  stack0xfffffffffffffa21 = 0;
  if (local_930._dirty == true) {
    TypedTimeSamples<std::array<float,_2UL>_>::update(&local_930);
  }
  local_908 = input;
  if (local_930._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_930._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if (local_930._dirty == true) {
      TypedTimeSamples<std::array<float,_2UL>_>::update(&local_930);
    }
    uStack_8e8 = 0;
    uStack_8e7 = 0;
    uStack_8e0 = 0;
    local_8f8.dynamic = (void *)0x0;
    local_8f8._8_1_ = 0;
    local_8f8._9_7_ = 0;
    if (local_930._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_930._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar6 = 8;
      uVar4 = 0;
      do {
        local_8c0 = &linb::any::vtable_for_type<std::array<float,2ul>>()::table;
        local_8d0.dynamic =
             (void *)*(undefined8 *)
                      ((long)&((Sample *)
                              (&(local_930._samples.
                                 super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->value + -1))->t + lVar6
                      );
        tinyusdz::value::TimeSamples::add_sample
                  ((TimeSamples *)&local_8f8,
                   *(double *)
                    ((long)(&(local_930._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start)->value + -2) + lVar6),
                   (Value *)&local_8d0);
        if (local_8c0 != (undefined **)0x0) {
          (*(code *)local_8c0[4])(&local_8d0);
        }
        uVar4 = uVar4 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar4 < (ulong)(((long)local_930._samples.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_930._samples.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)local_5f0,
                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)&local_8f8);
    stack0xfffffffffffffa21 = CONCAT17(uStack_8e0,local_5f0._17_7_);
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)&local_8f8);
  }
  local_938 = (char)uVar1;
  if (local_938 == '\x01') {
    cStack_937 = (char)((ushort)uVar1 >> 8);
    if (cStack_937 != '\0') {
      if (local_910 != (string *)0x0) {
        ::std::__cxx11::string::append((char *)local_910);
      }
      bVar3 = false;
      goto LAB_004d4004;
    }
    uStack_8e8 = 0xe8;
    uStack_8e7 = 0x6a74;
    local_8f8.dynamic = pvVar2;
    linb::any::operator=((any *)&local_610,(any *)&local_8f8);
    if (CONCAT71(uStack_8e7,uStack_8e8) != 0) {
      (**(code **)(CONCAT71(uStack_8e7,uStack_8e8) + 0x20))(&local_8f8);
    }
  }
  Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_610);
  bVar3 = true;
LAB_004d4004:
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_5f0);
  if ((undefined8 *)local_600._M_allocated_capacity != (undefined8 *)0x0) {
    (**(code **)(local_600._M_allocated_capacity + 0x20))(&local_610);
  }
  if (local_930._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_930._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_930._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_930._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar3 != false) {
    AttrMetas::operator=(&AStack_818,&local_908->_metas);
    Property::Property((Property *)&local_610,(Attribute *)local_8b8,false);
    Property::operator=(local_900,(Property *)&local_610);
    Property::~Property((Property *)&local_610);
  }
  AttrMetas::~AttrMetas(&AStack_818);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_850);
  if (local_860 != (vtable_type *)0x0) {
    (*local_860->destroy)(&local_870);
    local_860 = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_p != &local_880) {
    operator_delete(local_890._M_p,
                    CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
    operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
  }
  return bVar3;
}

Assistant:

bool ToProperty(const TypedAttributeWithFallback<Animatable<T>> &input,
                Property &output, std::string *err) {
#if 0
  if (input.is_blocked()) {
    Attribute attr;
    attr.set_blocked(input.is_blocked());
    attr.variability() = Variability::Uniform;
    attr.set_type_name(value::TypeTraits<T>::type_name());
    output = Property(std::move(attr), /*custom*/ false);
  } else if (input.is_value_empty()) {
    // type info only
    Property p;
    p.set_property_type(Property::Type::EmptyAttrib);
    p.attribute().set_type_name(value::TypeTraits<T>::type_name());
    p.set_custom(false);
    output = p;
  } else if (input.is_connection()) {
    // Use Relation for Connection(as typed relationshipTarget)
    // Single connection targetPath only.
    Relationship rel;
    std::vector<Path> pv = input.get_connections();
    if (pv.empty()) {
      DCOUT("??? Empty connectionTarget.");
      if (err) {
        (*err) += "[InternalError] Empty connectionTarget.";
      }
      return false;
    }
    if (pv.size() == 1) {
      DCOUT("targetPath = " << pv[0]);
      output = Property(pv[0], /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else if (pv.size() > 1) {
      output = Property(pv, /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else {
      DCOUT("??? GetConnection faile.");
      if (err) {
        (*err) += "[InternalError] Invalid connectionTarget.";
      }
      return false;
    }

  } else {
    // Includes !authored()
    // FIXME: Currently scalar only.
    Animatable<T> v = input.get_value();

    primvar::PrimVar pvar;

    if (v.is_timesamples()) {
      value::TimeSamples ts = ToTypelessTimeSamples(v.get_timesamples());
      pvar.set_timesamples(ts);
    } else if (v.is_scalar()) {
      T a;
      if (v.get_scalar(&a)) {
        value::Value val(a);
        pvar.set_value(val);
      } else {
        DCOUT("??? Invalid Animatable value.");
        if (err) {
          (*err) += "[InternalError] Invalid Animatable value.";
        }
        return false;
      }
    } else {
      DCOUT("??? Invalid Animatable value.");
      if (err) {
        (*err) += "[InternalError] Invalid Animatable value.";
      }
      return false;
    }

    Attribute attr;
    attr.set_var(std::move(pvar));
    attr.variability() = Variability::Varying;
    output = Property(attr, /* custom */ false);
  }
#else

  Attribute attr;
  attr.variability() = Variability::Varying;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  DCOUT("has_connections " << input.has_connections());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    attr.set_connections(input.get_connections());
  }

  {
    // Includes !authored()
    // FIXME: Currently scalar only.
    Animatable<T> v = input.get_value();

    primvar::PrimVar pvar;
    DCOUT("has_timesamples " << v.has_timesamples());
    DCOUT("has_value " << v.has_value());

    if (v.has_timesamples()) {
      value::TimeSamples ts = ToTypelessTimeSamples(v.get_timesamples());
      pvar.set_timesamples(ts);
    }

    if (v.has_value()) {
      T a;
      if (v.get_scalar(&a)) {
        value::Value val(a);
        pvar.set_value(val);
      } else {
        DCOUT("??? Invalid Animatable value.");
        if (err) {
          (*err) += "[InternalError] Invalid Animatable value.";
        }
        return false;
      }
    }

    attr.set_var(std::move(pvar));
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /* custom */ false);

#endif

  return true;
}